

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseAssembler::section(BaseAssembler *this,Section *section)

{
  Section **ppSVar1;
  Section *in_RSI;
  BaseAssembler *in_RDI;
  float __x;
  Error err;
  BaseAssembler *pBVar2;
  Error local_38;
  
  if ((in_RDI->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    pBVar2 = in_RDI;
    DebugUtils::errored(5);
    local_38 = BaseEmitter::reportError
                         (&pBVar2->super_BaseEmitter,(Error)((ulong)in_RSI >> 0x20),(char *)in_RDI);
  }
  else {
    pBVar2 = in_RDI;
    if ((in_RSI->_id < *(uint *)&((in_RDI->super_BaseEmitter)._code)->field_0xe0) &&
       (ppSVar1 = ZoneVector<asmjit::v1_14::Section_*>::operator[]
                            ((ZoneVector<asmjit::v1_14::Section_*> *)in_RSI,(size_t)in_RDI),
       *ppSVar1 == in_RSI)) {
      if ((in_RDI->super_BaseEmitter)._logger != (Logger *)0x0) {
        Logger::logf((in_RDI->super_BaseEmitter)._logger,__x);
      }
      BaseAssembler_initSection(in_RDI,in_RSI);
      return 0;
    }
    err = (Error)((ulong)in_RSI >> 0x20);
    DebugUtils::errored(0x13);
    local_38 = BaseEmitter::reportError(&pBVar2->super_BaseEmitter,err,(char *)in_RDI);
  }
  return local_38;
}

Assistant:

Error BaseAssembler::section(Section* section) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  if (!_code->isSectionValid(section->id()) || _code->_sections[section->id()] != section)
    return reportError(DebugUtils::errored(kErrorInvalidSection));

#ifndef ASMJIT_NO_LOGGING
  if (_logger)
    _logger->logf(".section %s {#%u}\n", section->name(), section->id());
#endif

  BaseAssembler_initSection(this, section);
  return kErrorOk;
}